

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int ribesl(double x,double alpha,int nb,int ize,double *b)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  if (((((nb < 1) || (x < 0.0)) || (alpha < 0.0)) || ((1.0 <= alpha || (709.0 < x && ize == 1)))) ||
     (10000.0 < x && ize == 2)) {
    iVar2 = i4_min(nb,0);
    uVar9 = iVar2 - 1;
  }
  else {
    uVar9 = nb;
    if (x < 0.0001) {
      dVar17 = 1.0;
      dVar12 = alpha + 1.0;
      dVar16 = (double)(-(ulong)(8.9e-308 < x) & (ulong)(x * 0.5));
      if ((alpha != 0.0) || (NAN(alpha))) {
        dVar17 = pow(dVar16,alpha);
        dVar11 = tgamma(dVar12);
        dVar17 = dVar17 / dVar11;
      }
      if (ize == 2) {
        dVar11 = exp(-x);
        dVar17 = dVar17 * dVar11;
      }
      dVar11 = (double)(-(ulong)(1.0 < x + 1.0) & (ulong)(dVar16 * dVar16));
      dVar15 = (dVar11 * dVar17) / dVar12 + dVar17;
      *b = dVar15;
      uVar9 = 0;
      if (x == 0.0 || dVar15 != 0.0) {
        uVar9 = nb;
      }
      if (nb != 1) {
        if ((x != 0.0) || (NAN(x))) {
          iVar2 = 2;
          if (2 < nb) {
            iVar2 = nb;
          }
          uVar5 = 2;
          uVar10 = uVar9;
          do {
            dVar17 = dVar17 / dVar12;
            dVar12 = dVar12 + 1.0;
            dVar17 = dVar17 * dVar16;
            dVar17 = (double)((ulong)dVar17 &
                             -(ulong)((double)(~-(ulong)(dVar11 != 0.0) & (ulong)(1.78e-307 / x) |
                                              (ulong)(8.9e-308 / dVar11) & -(ulong)(dVar11 != 0.0))
                                      * dVar12 < dVar17));
            dVar15 = (dVar11 * dVar17) / dVar12 + dVar17;
            b[uVar5 - 1] = dVar15;
            uVar9 = (int)uVar5 - 1;
            if ((long)(int)uVar10 <= (long)uVar5) {
              uVar9 = uVar10;
            }
            if (dVar15 != 0.0) {
              uVar9 = uVar10;
            }
            if (NAN(dVar15)) {
              uVar9 = uVar10;
            }
            uVar5 = uVar5 + 1;
            uVar10 = uVar9;
          } while (uVar5 != iVar2 + 1);
        }
        else {
          iVar2 = 2;
          if (2 < nb) {
            iVar2 = nb;
          }
          memset(b + 1,0,(ulong)(iVar2 - 1) << 3);
        }
      }
    }
    else {
      iVar2 = (int)x;
      dVar12 = alpha + alpha;
      dVar16 = (double)(iVar2 * 2 + 2) + dVar12;
      dVar17 = dVar16 / x;
      if (iVar2 < 0x29) {
        dVar11 = pow(1.585,(double)iVar2);
        dVar11 = 2e+16 / dVar11;
      }
      else {
        dVar11 = dVar17 * 2e+16;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
      }
      uVar8 = iVar2 + 1;
      uVar10 = uVar8;
      if (nb - iVar2 < 3) {
        dVar19 = 1.0;
        bVar1 = false;
      }
      else {
        uVar3 = nb - 1;
        if (iVar2 + 2 < nb) {
          uVar10 = nb - 1;
          dVar15 = 1.0;
LAB_0019c18a:
          dVar19 = dVar17;
          dVar16 = dVar16 + 2.0;
          dVar17 = (dVar16 * dVar19) / x + dVar15;
          if (dVar17 <= 1e+292) goto code_r0x0019c1af;
          dVar15 = dVar17 / 1e+308;
          dVar14 = dVar19 / 1e+308;
          dVar17 = dVar14;
          dVar11 = dVar15;
          uVar10 = uVar8;
          do {
            dVar19 = dVar11;
            dVar18 = dVar17;
            dVar16 = dVar16 + 2.0;
            dVar11 = (dVar16 * dVar19) / x + dVar18;
            uVar10 = uVar10 + 1;
            dVar17 = dVar19;
          } while (dVar11 <= 1.0);
          dVar11 = (0.5 - 0.5 / ((dVar16 / x) * (dVar16 / x))) * ((dVar18 * dVar19) / 1e+16);
          dVar17 = dVar19 * 1e+308;
          dVar16 = dVar16 + -2.0;
          uVar3 = i4_min(nb,uVar10);
          while( true ) {
            uVar8 = uVar8 + 1;
            bVar1 = true;
            uVar9 = uVar3;
            if ((int)uVar3 <= (int)uVar8) break;
            dVar13 = dVar14 + (dVar16 * dVar15) / x;
            dVar18 = dVar15 * dVar13;
            dVar14 = dVar15;
            uVar9 = uVar8;
            dVar15 = dVar13;
            if (dVar11 < dVar18) break;
          }
        }
        else {
          dVar19 = 1.0;
LAB_0019c203:
          bVar1 = false;
        }
        if (!bVar1) {
          dVar15 = dVar19 * 1e+16;
          if (dVar15 < 0.0) {
            dVar15 = sqrt(dVar15);
          }
          else {
            dVar15 = SQRT(dVar15);
          }
          dVar14 = dVar17 + dVar17;
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          dVar16 = (double)(int)(uVar3 * 2) + dVar12;
          dVar11 = r8_max(dVar11,dVar15 * dVar14);
          uVar10 = uVar3;
        }
      }
      dVar15 = dVar17;
      if (!bVar1) {
        do {
          uVar10 = uVar10 + 1;
          dVar16 = dVar16 + 2.0;
          dVar17 = (dVar16 * dVar15) / x + dVar19;
          dVar19 = dVar15;
          dVar15 = dVar17;
        } while (dVar17 < dVar11);
      }
      uVar8 = uVar10 + 1;
      dVar16 = dVar16 + 2.0;
      dVar11 = (double)(int)uVar10;
      dVar17 = 1.0 / dVar17;
      dVar15 = dVar11 + alpha;
      dVar12 = dVar12 + dVar11 + -1.0;
      dVar19 = (dVar15 * dVar17 * dVar12) / dVar11;
      iVar2 = uVar8 - nb;
      if (iVar2 < 0) {
        b[(int)uVar10] = dVar17;
        uVar5 = 1;
        if (1 < -iVar2) {
          uVar5 = (ulong)(uint)-iVar2;
        }
        do {
          b[(int)uVar8] = 0.0;
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        if (1 < (int)uVar10) {
          dVar17 = b[uVar10];
          lVar7 = (ulong)uVar10 + 1;
          iVar2 = uVar10 - 1;
          do {
            dVar16 = dVar16 + -2.0;
            dVar17 = (dVar17 * dVar16) / x + b[lVar7];
            b[lVar7 + -2] = dVar17;
            dVar14 = 1.0;
            if (lVar7 != 3) {
              dVar14 = dVar12 + -1.0;
            }
            lVar7 = lVar7 + -1;
            dVar11 = dVar11 + -1.0;
            dVar15 = dVar15 + -1.0;
            dVar19 = ((dVar19 + dVar17 * dVar15) * dVar14) / dVar11;
            iVar2 = iVar2 + -1;
            dVar12 = dVar14;
          } while (iVar2 != 0);
        }
        dVar17 = ((dVar15 + dVar15) * b[1]) / x + b[2];
        *b = dVar17;
        dVar17 = dVar19 + dVar19 + dVar17;
      }
      else {
        dVar14 = 0.0;
        if (iVar2 != 0) {
          iVar4 = 1;
          if (1 < iVar2) {
            iVar4 = iVar2;
          }
          dVar18 = 0.0;
          do {
            dVar14 = dVar17;
            dVar16 = dVar16 + -2.0;
            dVar17 = (dVar16 * dVar14) / x + dVar18;
            dVar11 = dVar11 + -1.0;
            if (uVar8 == 3) {
              dVar12 = 1.0;
            }
            else {
              dVar12 = dVar12 + -1.0;
              if (uVar8 == 2) {
                uVar8 = 1;
                break;
              }
            }
            dVar15 = dVar15 + -1.0;
            dVar19 = ((dVar17 * dVar15 + dVar19) * dVar12) / dVar11;
            uVar8 = uVar8 - 1;
            iVar4 = iVar4 + -1;
            dVar18 = dVar14;
          } while (iVar4 != 0);
        }
        b[(long)(int)uVar8 + -1] = dVar17;
        if (nb == 1) {
          dVar17 = dVar17 + dVar19 + dVar19;
        }
        else {
          dVar16 = dVar16 + -2.0;
          dVar14 = dVar14 + (dVar17 * dVar16) / x;
          b[(long)(int)uVar8 + -2] = dVar14;
          if (2 < (int)uVar8) {
            dVar11 = dVar11 + -1.0;
            if (uVar8 == 3) {
              dVar12 = 1.0;
            }
            else {
              dVar12 = dVar12 + -1.0;
            }
            dVar15 = dVar15 + -1.0;
            dVar19 = ((dVar14 * dVar15 + dVar19) * dVar12) / dVar11;
            if (uVar8 != 3) {
              uVar5 = (ulong)uVar8;
              dVar17 = b[uVar5 - 2];
              lVar7 = -4;
              do {
                dVar16 = dVar16 + -2.0;
                dVar17 = (dVar17 * dVar16) / x + b[uVar5 + lVar7 + 3];
                b[uVar5 + lVar7 + 1] = dVar17;
                dVar14 = 1.0;
                if (uVar5 + lVar7 != 0) {
                  dVar14 = dVar12 + -1.0;
                }
                dVar11 = dVar11 + -1.0;
                dVar15 = dVar15 + -1.0;
                dVar19 = ((dVar19 + dVar17 * dVar15) * dVar14) / dVar11;
                lVar7 = lVar7 + -1;
                dVar12 = dVar14;
              } while (uVar8 + (int)lVar7 != -1);
            }
            *b = ((dVar15 + dVar15) * b[1]) / x + b[2];
          }
          dVar17 = dVar19 + dVar19 + *b;
        }
      }
      if ((alpha != 0.0) || (NAN(alpha))) {
        dVar12 = tgamma(alpha + 1.0);
        dVar16 = pow(x * 0.5,-alpha);
        dVar17 = dVar17 * dVar12 * dVar16;
      }
      if (ize == 1) {
        dVar12 = exp(-x);
        dVar17 = dVar17 * dVar12;
      }
      dVar12 = (double)(~-(ulong)(1.0 < dVar17) & 0x2fffba634018db |
                       (ulong)(dVar17 * 8.9e-308) & -(ulong)(1.0 < dVar17));
      uVar5 = 1;
      if (1 < nb) {
        uVar5 = (ulong)(uint)nb;
      }
      uVar6 = 0;
      do {
        if (b[uVar6] <= dVar12 && dVar12 != b[uVar6]) {
          b[uVar6] = 0.0;
        }
        b[uVar6] = b[uVar6] / dVar17;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
  }
  return uVar9;
code_r0x0019c1af:
  iVar2 = (2 - nb) + uVar8;
  uVar8 = uVar8 + 1;
  dVar15 = dVar19;
  if (iVar2 == 0) goto LAB_0019c203;
  goto LAB_0019c18a;
}

Assistant:

int ribesl ( double x, double alpha, int nb, int ize, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    RIBESL calculates I Bessel function with non-integer orders.
//
//  Discussion:
//
//    This routine calculates Bessel functions I SUB(N+ALPHA) (X)
//    for non-negative argument X, and non-negative order N+ALPHA,
//    with or without exponential scaling.
//
//    This program is based on a program written by David
//    Sookne that computes values of the Bessel functions J or
//    I of real argument and integer order.  Modifications include
//    the restriction of the computation to the I Bessel function
//    of non-negative real argument, the extension of the computation
//    to arbitrary positive order, the inclusion of optional
//    exponential scaling, and the elimination of most underflow.
//
//    In case of an error, NCALC will not equal NB, and not all I's are
//    calculated to the desired accuracy.
//
//    If NCALC < 0:  An argument is out of range. For example,
//    NB <= 0, IZE is not 1 or 2, or IZE = 1 and EXPARG <= ABS(X)
//    In this case, the B-vector is not calculated, and NCALC is
//    set to MIN(NB,0)-1 so that NCALC /= NB.
//
//    If 0 < NCALC < NB, then not all requested function values could
//    be calculated accurately.  This usually occurs because NB is
//    much larger than ABS(X).  In this case, B(N) is calculated
//    to the desired accuracy for N <= NCALC, but precision
//    is lost for NCALC < N <= NB.  If B(N) does not vanish
//    for NCALC < N (because it is too small to be represented),
//    and B(N)/B(NCALC) = 10**(-K), then only the first NSIG-K
//    significant figures of B(N) can be trusted.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 March 2007
//
//  Author:
//
//    Original FORTRAN77 version by William Cody.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Frank Olver, David Sookne,
//    A Note on Backward Recurrence Algorithms,
//    Mathematics of Computation,
//    Volume 26, 1972, pages 941-947.
//
//    David Sookne,
//    Bessel Functions of Real Argument and Integer Order,
//    NBS Journal of Research B,
//    Volume 77B, 1973, pages 125-132.
//
//    William Cody,
//    Algorithm 597:
//    Sequence of Modified Bessel Functions of the First Kind,
//    ACM Transactions of Mathematical Software,
//    Volume 9, Number 2, June 1983, pages 242-245.
//
//  Parameters:
//
//    Input, double X, the argument for which the functions
//    are to be calculated.
//
//    Input, double ALPHA,the fractional part of the order
//    for which the functions are to be calculated.
//    0 <= ALPHA < 1.0.
//
//    Input, int NB, the number of functions to be calculated.
//    The first function calculated is of order ALPHA, and the
//    last is of order (NB - 1 + ALPHA).  1 <= NB.
//
//    Input, int IZE, scaling option.
//    1, unscaled I's are to calculated,
//    2, exponentially scaled I's are to be calculated.
//
//    Output, double B[NB], the values of the functions
//    I(ALPHA,X) through I(NB-1+ALPHA,X), with scaling if requested.
//
//    Output, int RIBESL, the value of NCALC, the error indicator.
//    If NCALC = NB, then all the requested values were calculated
//    to the desired accuracy.
//
//  Local Parameeters:
//
//    BETA, the radix for the floating-point system.
//
//    MINEXP, smallest representable power of BETA.
//
//    MAXEXP, smallest power of BETA that overflows
//
//    IT, number of bits in the mantissa of a working precision variable.
//
//    NSIG, decimal significance desired.  Should be set to
//    INT(LOG10(2)*IT+1).  Setting NSIG lower will result
//    in decreased accuracy while setting NSIG higher will
//    increase CPU time without increasing accuracy.  The
//    truncation error is limited to a relative error of
//    T=.5*10^(-NSIG).
//
//    ENTEN, 10.0^K, where K is the largest integer such that
//    ENTEN is machine-representable in working precision
//
//    ENSIG, 10.0^NSIG
//
//    RTNSIG, 10.0^(-K) for the smallest integer K such that
//    NSIG/4 <= K.
//
//    ENMTEN, smallest ABS(X) such that X/4 does not underflow
//
//    XLARGE, upper limit on the magnitude of X when IZE=2.  Bear
//    in mind that if ABS(X)=N, then at least N iterations
//    of the backward recursion will be executed.  The value
//    of 10.0^4 is used on every machine.
//
//    EXPARG, largest working precision argument that the library
//    EXP routine can handle and upper limit on the
//    magnitude of X when IZE=1; approximately log(BETA^MAXEXP).
//
//    Approximate values for some important machines are:
//
//                        beta       minexp      maxexp       it
//
//  CRAY-1        (S.P.)    2        -8193        8191        48
//  Cyber 180/855
//    under NOS   (S.P.)    2         -975        1070        48
//  IEEE (IBM/XT,
//    SUN, etc.)  (S.P.)    2         -126         128        24
//  IEEE (IBM/XT,
//    SUN, etc.)  (D.P.)    2        -1022        1024        53
//  IBM 3033      (D.P.)   16          -65          63        14
//  VAX           (S.P.)    2         -128         127        24
//  VAX D-Format  (D.P.)    2         -128         127        56
//  VAX G-Format  (D.P.)    2        -1024        1023        53
//
//
//                        NSIG       ENTEN       ENSIG      RTNSIG
//
// CRAY-1        (S.P.)    15       1.0E+2465   1.0E+15     1.0E-4
// Cyber 180/855
//   under NOS   (S.P.)    15       1.0E+322    1.0E+15     1.0E-4
// IEEE (IBM/XT,
//   SUN, etc.)  (S.P.)     8       1.0E+38     1.0E+8      1.0E-2
// IEEE (IBM/XT,
//   SUN, etc.)  (D.P.)    16       1.0D+308    1.0D+16     1.0D-4
// IBM 3033      (D.P.)     5       1.0D+75     1.0D+5      1.0D-2
// VAX           (S.P.)     8       1.0E+38     1.0E+8      1.0E-2
// VAX D-Format  (D.P.)    17       1.0D+38     1.0D+17     1.0D-5
// VAX G-Format  (D.P.)    16       1.0D+307    1.0D+16     1.0D-4
//
//
//                         ENMTEN      XLARGE   EXPARG
//
// CRAY-1        (S.P.)   1.84E-2466   1.0E+4    5677
// Cyber 180/855
//   under NOS   (S.P.)   1.25E-293    1.0E+4     741
// IEEE (IBM/XT,
//   SUN, etc.)  (S.P.)   4.70E-38     1.0E+4      88
// IEEE (IBM/XT,
//   SUN, etc.)  (D.P.)   8.90D-308    1.0D+4     709
// IBM 3033      (D.P.)   2.16D-78     1.0D+4     174
// VAX           (S.P.)   1.17E-38     1.0E+4      88
// VAX D-Format  (D.P.)   1.17D-38     1.0D+4      88
// VAX G-Format  (D.P.)   2.22D-308    1.0D+4     709
//
{
  double constant = 1.585;
  double em;
  double empal;
  double emp2al;
  double en;
  double enmten = 8.9E-308;
  double ensig = 1.0E+16;
  double enten = 1.0E+308;
  double exparg = 709.0;
  bool flag;
  double half = 0.5;
  double halfx;
  int i;
  int k;
  int l;
  int magx;
  int n;
  int nbmx;
  int ncalc;
  int nend;
  int nsig = 16;
  int nstart;
  double one = 1.0;
  double p;
  double plast;
  double pold;
  double psave;
  double psavel;
  double rtnsig = 1.0E-04;
  double tempa;
  double tempb;
  double tempc;
  double test;
  double total;
  double tover;
  double two = 2.0;
  double xlarge = 1.0E+04;
  double zero = 0.0;
//
//  Check for X, NB, OR IZE out of range.
//
  if ( nb <= 0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( x < 0.0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( alpha < 0.0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( 1.0 <= alpha )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( ize == 1 && exparg < x )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( ize == 2 && xlarge < x )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }
//
//  Use 2-term ascending series for small X.
//
  ncalc = nb;
  magx = static_cast< int > (x);
//
//  Initialize the forward sweep, the P-sequence of Olver.
//
  if ( rtnsig <= x )
  {
    nbmx = nb - magx;
    n = magx + 1;
    en = static_cast<double>(n + n ) + ( alpha + alpha );
    plast = one;
    p = en / x;
//
//  Calculate general significance test.
//
    test = ensig + ensig;

    if ( 5 * nsig < 2 * magx )
    {
      test = sqrt ( test * p );
    }
    else
    {
      test = test / pow ( constant, magx );
    }
//
//  Calculate P-sequence until N = NB-1.  Check for possible overflow.
//
    flag = false;

    if ( 3 <= nbmx )
    {
      tover = enten / ensig;
      nstart = magx + 2;
      nend = nb - 1;

      for ( k = nstart; k <= nend; k++ )
      {
        n = k;
        en = en + two;
        pold = plast;
        plast = p;
        p = en * plast / x + pold;
//
//  To avoid overflow, divide P-sequence by TOVER.  Calculate
//  P-sequence until 1 < ABS(P).
//
        if ( tover < p )
        {
          tover = enten;
          p = p / tover;
          plast = plast / tover;
          psave = p;
          psavel = plast;
          nstart = n + 1;

          for ( ; ; )
          {
            n = n + 1;
            en = en + two;
            pold = plast;
            plast = p;
            p = en * plast / x + pold;

            if ( 1.0 < p )
            {
              break;
            }
          }

          tempb = en / x;
//
//  Calculate backward test, and find NCALC, the highest N
//  such that the test is passed.
//
          test = pold * plast / ensig;
          test = test * ( half - half / ( tempb * tempb ) );
          p = plast * tover;
          n = n - 1;
          en = en - two;
          nend = i4_min ( nb, n );

          ncalc = nend + 1;

          for ( l = nstart; l <= nend; l++ )
          {
            pold = psavel;
            psavel = psave;
            psave = en * psavel / x + pold;

            if ( test < psave * psavel )
            {
              ncalc = l;
              break;
            }
          }
          ncalc = ncalc - 1;
          flag = true;
          break;
        }
      }

      if ( !flag )
      {
        n = nend;
        en = static_cast<double>(n + n ) + ( alpha + alpha );
//
//  Calculate special significance test for 2 < NBMX.
//
        test = r8_max ( test, sqrt ( plast * ensig ) * sqrt ( p + p ) );
      }
    }
//
//  Calculate P-sequence until significance test passed.
//
    if ( !flag )
    {
      for ( ; ; )
      {
        n = n + 1;
        en = en + two;
        pold = plast;
        plast = p;
        p = en * plast / x + pold;

        if ( test <= p )
        {
          break;
        }
      }
    }
//
//  Initialize the backward recursion and the normalization sum.
//
    n = n + 1;
    en = en + two;
    tempb = zero;
    tempa = one / p;
    em = static_cast<double>(n ) - one;
    empal = em + alpha;
    emp2al = ( em - one ) + ( alpha + alpha );
    total = tempa * empal * emp2al / em;
    nend = n - nb;
//
//  N < NB, so store B(N) and set higher orders to zero.
//
    if ( nend < 0 )
    {
      b[n-1] = tempa;
      nend = -nend;

      for ( l = 1; l <= nend; l++ )
      {
        b[n+l-1] = zero;
      }

      nend = n - 2;
//
//  Calculate via difference equation and store B(N), until N = 2.
//
      if ( 0 < nend )
      {
        for ( l = 1; l <= nend; l++ )
        {
          n = n - 1;
          en = en - two;
          b[n-1] = ( en * b[n] ) / x + b[n+1];
          em = em - one;
          emp2al = emp2al - one;
          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + b[n-1] * empal ) * emp2al / em;
        }
      }
//
//  Calculate B(1).
//
      b[0] = two * empal * b[1] / x + b[2];

      total = ( total + total ) + b[0];
    }
//
//  Recur backward via difference equation, calculating (but
//  not storing) B(N), until N = NB.
//
    else
    {
      if ( 0 < nend )
      {
        for ( l = 1; l <= nend; l++ )
        {
          n = n - 1;
          en = en - two;
          tempc = tempb;
          tempb = tempa;
          tempa = ( en * tempb ) / x + tempc;
          em = em - one;
          emp2al = emp2al - one;

          if ( n == 1 )
          {
            break;
          }

          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + tempa * empal ) * emp2al / em;
        }
      }
//
//  Store B(NB).
//
      b[n-1] = tempa;

      if ( nb <= 1 )
      {
        total = ( total + total ) + tempa;
      }
//
//  Calculate and Store B(NB-1).
//
      else
      {
        n = n - 1;
        en = en - two;
        b[n-1] = ( en * tempa ) / x + tempb;

        if ( 1 < n  )
        {
          em = em - one;
          emp2al = emp2al - one;

          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + b[n-1] * empal ) * emp2al / em;

          nend = n - 2;
//
//  Calculate via difference equation and store B(N), until N = 2.
//
          if ( 0 < nend )
          {
            for ( l = 1; l <= nend; l++ )
            {
              n = n - 1;
              en = en - two;
              b[n-1] = ( en * b[n] ) / x + b[n+1];
              em = em - one;
              emp2al = emp2al - one;
              if ( n == 2 )
              {
                emp2al = one;
              }
              empal = empal - one;
              total = ( total + b[n-1] * empal ) * emp2al / em;
            }
          }
//
//  Calculate B(1).
//
          b[0] = two * empal * b[1] / x + b[2];
        }
        total = ( total + total ) + b[0];
      }
    }
//
//  Normalize.  Divide all B(N) by TOTAL.
//
    if ( alpha != zero )
    {
       total = total * tgamma ( one + alpha ) * pow ( x * half, -alpha );
    }

    if ( ize == 1 )
    {
      total = total * exp ( -x );
    }

    tempa = enmten;

    if ( 1.0 < total )
    {
      tempa = tempa * total;
    }

    for ( n = 1; n <= nb; n++ )
    {
      if ( b[n-1] < tempa )
      {
        b[n-1] = zero;
      }
      b[n-1] = b[n-1] / total;
    }

    return ncalc;
  }
//
//  Two-term ascending series for small X.
//
  else
  {
    tempa = one;
    empal = one + alpha;
    halfx = zero;

    if ( enmten < x )
    {
      halfx = half * x;
    }

    if ( alpha != zero )
    {
      tempa = pow ( halfx, alpha ) / tgamma ( empal );
    }

    if ( ize == 2 )
    {
      tempa = tempa * exp ( - x );
    }

    tempb = zero;

    if ( one < x + one )
    {
      tempb = halfx * halfx;
    }

    b[0] = tempa + tempa * tempb / empal;

    if ( x != zero && b[0] == zero )
    {
      ncalc = 0;
    }

    if ( 1 < nb )
    {
      if ( x == zero )
      {
        for ( i = 1; i < nb; i++ )
        {
          b[i] = zero;
        }
      }
//
//  Calculate higher-order functions.
//
      else
      {
        tempc = halfx;
        tover = ( enmten + enmten ) / x;

        if ( tempb != zero )
        {
          tover = enmten / tempb;
        }

        for ( n = 2; n <= nb; n++ )
        {
          tempa = tempa / empal;
          empal = empal + one;
          tempa = tempa * tempc;

          if ( tempa <= tover * empal )
          {
            tempa = zero;
          }

          b[n-1] = tempa + tempa * tempb / empal;

          if ( b[n-1] == zero && n < ncalc )
          {
            ncalc = n - 1;
          }
        }
      }
    }
  }

  return ncalc;
}